

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O0

void __thiscall ast::FunctionLiteral::~FunctionLiteral(FunctionLiteral *this)

{
  bool bVar1;
  reference ppIVar2;
  Identifier *param;
  iterator __end2;
  iterator __begin2;
  vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_> *__range2;
  FunctionLiteral *this_local;
  
  (this->super_Expr).super_Node._vptr_Node = (_func_int **)&PTR__FunctionLiteral_001e1468;
  if (this->header != (Identifier *)0x0) {
    (*(this->header->super_Expr).super_Node._vptr_Node[1])();
  }
  this->header = (Identifier *)0x0;
  __end2 = std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::begin
                     (&this->parameters);
  param = (Identifier *)
          std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::end(&this->parameters)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<ast::Identifier_**,_std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>_>
                      (&__end2,(__normal_iterator<ast::Identifier_**,_std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>_>
                                *)&param);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<ast::Identifier_**,_std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>_>
              ::operator*(&__end2);
    if (*ppIVar2 != (Identifier *)0x0) {
      (*((*ppIVar2)->super_Expr).super_Node._vptr_Node[1])();
    }
    __gnu_cxx::
    __normal_iterator<ast::Identifier_**,_std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::clear(&this->parameters);
  if (this->body != (BlockStmt *)0x0) {
    (*(this->body->super_Stmt).super_Node._vptr_Node[1])();
  }
  this->body = (BlockStmt *)0x0;
  std::vector<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>::~vector(&this->parameters);
  token::Token::~Token(&this->tok);
  Expr::~Expr(&this->super_Expr);
  return;
}

Assistant:

~FunctionLiteral(){
        delete  header;
        header = nullptr;
        for(auto param: parameters){
            delete  param;
            param = nullptr;
        }
        parameters.clear();
        delete body;
        body = nullptr;
    }